

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<unsigned_short>::abstract_value
          (abstract_value<unsigned_short> *this,abstract_value<unsigned_short> *rhs)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<unsigned_short> local_28;
  abstract_value<unsigned_short> *local_18;
  abstract_value<unsigned_short> *rhs_local;
  abstract_value<unsigned_short> *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  Value::Value(&this->super_Value);
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_002d9078;
  std::shared_ptr<unsigned_short>::shared_ptr(&this->m_result);
  this->m_store = (unsigned_short *)0x0;
  this->m_default = false;
  this->m_implicit = false;
  std::__cxx11::string::string((string *)&this->m_default_value);
  std::__cxx11::string::string((string *)&this->m_implicit_value);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->m_result);
  if (bVar1) {
    std::make_shared<unsigned_short>();
    std::shared_ptr<unsigned_short>::operator=(&this->m_result,&local_28);
    std::shared_ptr<unsigned_short>::~shared_ptr(&local_28);
    peVar2 = std::__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->m_result).
                         super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>);
    this->m_store = peVar2;
  }
  else {
    this->m_store = local_18->m_store;
  }
  this->m_default = (bool)(local_18->m_default & 1);
  this->m_implicit = (bool)(local_18->m_implicit & 1);
  std::__cxx11::string::operator=
            ((string *)&this->m_default_value,(string *)&local_18->m_default_value);
  std::__cxx11::string::operator=
            ((string *)&this->m_implicit_value,(string *)&local_18->m_implicit_value);
  return;
}

Assistant:

abstract_value(const abstract_value& rhs)
      {
        if (rhs.m_result)
        {
          m_result = std::make_shared<T>();
          m_store = m_result.get();
        }
        else
        {
          m_store = rhs.m_store;
        }

        m_default = rhs.m_default;
        m_implicit = rhs.m_implicit;
        m_default_value = rhs.m_default_value;
        m_implicit_value = rhs.m_implicit_value;
      }